

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O0

void __thiscall ScenePreprocessorTest::SetUp(ScenePreprocessorTest *this)

{
  aiScene *this_00;
  aiNode *this_01;
  ScenePreprocessor *this_02;
  ScenePreprocessorTest *this_local;
  
  this_00 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_00);
  this->mScene = this_00;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  this->mScene->mRootNode = this_01;
  aiString::Set(&this->mScene->mRootNode->mName,"<test>");
  (this->mScene->mRootNode->mTransformation).a4 = 1.0;
  (this->mScene->mRootNode->mTransformation).b4 = 2.0;
  (this->mScene->mRootNode->mTransformation).c4 = 3.0;
  this_02 = (ScenePreprocessor *)operator_new(8);
  Assimp::ScenePreprocessor::ScenePreprocessor(this_02,this->mScene);
  this->mScenePreprocessor = this_02;
  return;
}

Assistant:

void ScenePreprocessorTest::SetUp() {
    // setup a dummy scene with a single node
    mScene = new aiScene();
    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mName.Set("<test>");

    // add some translation
    mScene->mRootNode->mTransformation.a4 = 1.f;
    mScene->mRootNode->mTransformation.b4 = 2.f;
    mScene->mRootNode->mTransformation.c4 = 3.f;

    // and allocate a ScenePreprocessor to operate on the scene
    mScenePreprocessor = new ScenePreprocessor(mScene);
}